

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O0

void __thiscall gui::DialogBox::draw(DialogBox *this,RenderTarget *target,RenderStates states)

{
  float fVar1;
  bool bVar2;
  element_type *peVar3;
  RectangleShape *in_RSI;
  ContainerBase *in_RDI;
  float fVar4;
  shared_ptr<gui::Widget> *child;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *__range1;
  RenderStates *in_stack_00000060;
  float outlineThickness;
  RectangleShape *in_stack_ffffffffffffff88;
  RectangleShape *in_stack_ffffffffffffff90;
  RectangleShape *this_00;
  __normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
  local_30;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *local_28;
  Vector2<float> local_1c;
  float local_14;
  RectangleShape *local_10;
  
  local_10 = in_RSI;
  bVar2 = Widget::isVisible((Widget *)(in_RDI + 1));
  if (bVar2) {
    Widget::getTransform((Widget *)0x24e945);
    sf::operator*=((Transform *)in_stack_ffffffffffffff90,(Transform *)in_stack_ffffffffffffff88);
    std::__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x24e967);
    sf::RectangleShape::setSize(in_stack_ffffffffffffff90,(Vector2f *)in_stack_ffffffffffffff88);
    this_00 = local_10;
    std::__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x24e99a);
    sf::RenderTarget::draw((RenderTarget *)this,(Drawable *)target,in_stack_00000060);
    peVar3 = std::__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x24e9c1);
    local_14 = sf::Shape::getOutlineThickness(&(peVar3->rect_).super_Shape);
    peVar3 = std::__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x24e9e4);
    sf::Transformable::setPosition
              (&(peVar3->titleBar_).super_Shape.super_Transformable,-local_14,-local_14);
    std::__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x24ea2e);
    fVar1 = *(float *)((long)&in_RDI[0x10].children_.
                              super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + 4);
    fVar4 = local_14 + local_14;
    peVar3 = std::__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x24ea66);
    sf::Vector2<float>::Vector2(&local_1c,fVar4 + fVar1,peVar3->titleBarHeight_);
    sf::RectangleShape::setSize(this_00,(Vector2f *)in_stack_ffffffffffffff88);
    std::__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x24eaa8);
    sf::RenderTarget::draw((RenderTarget *)this,(Drawable *)target,in_stack_00000060);
    local_28 = ContainerBase::getChildren(in_RDI);
    local_30._M_current =
         (shared_ptr<gui::Widget> *)
         std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>::
         begin((vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                *)in_stack_ffffffffffffff88);
    std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>::end
              ((vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                *)in_stack_ffffffffffffff88);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
                               *)this_00,
                              (__normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
                               *)in_stack_ffffffffffffff88), bVar2) {
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
      ::operator*(&local_30);
      in_stack_ffffffffffffff88 = local_10;
      std::__shared_ptr_access<gui::Widget,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                ((__shared_ptr_access<gui::Widget,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 this_00);
      sf::RenderTarget::draw((RenderTarget *)this,(Drawable *)target,in_stack_00000060);
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
      ::operator++(&local_30);
    }
  }
  return;
}

Assistant:

void DialogBox::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (!isVisible()) {
        return;
    }
    states.transform *= getTransform();

    style_->rect_.setSize(size_);
    target.draw(style_->rect_, states);
    float outlineThickness = style_->rect_.getOutlineThickness();
    style_->titleBar_.setPosition(-outlineThickness, -outlineThickness);
    style_->titleBar_.setSize({size_.x + outlineThickness * 2.0f, style_->titleBarHeight_});
    target.draw(style_->titleBar_, states);

    for (const auto& child : getChildren()) {
        target.draw(*child, states);
    }
}